

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_gather_stat(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  void *output;
  long lVar5;
  
  iVar4 = ref_histogram->nstat;
  if ((long)iVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x14c,"ref_histogram_gather_stat","malloc stats of REF_DBL negative");
    uVar3 = 1;
  }
  else {
    output = malloc((long)iVar4 * 8);
    if (output == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x14c,"ref_histogram_gather_stat","malloc stats of REF_DBL NULL");
      uVar3 = 2;
    }
    else {
      uVar3 = ref_mpi_sum(ref_mpi,ref_histogram->stats,output,iVar4,3);
      if (uVar3 == 0) {
        if (ref_mpi->id == 0) {
          if ((long)ref_histogram->nbin < 1) {
            iVar4 = 0;
          }
          else {
            lVar5 = 0;
            iVar4 = 0;
            do {
              iVar4 = iVar4 + ref_histogram->bins[lVar5];
              lVar5 = lVar5 + 1;
            } while (ref_histogram->nbin != lVar5);
          }
          if ((0 < iVar4) && (iVar1 = ref_histogram->nstat, 0 < (long)iVar1)) {
            pRVar2 = ref_histogram->stats;
            lVar5 = 0;
            do {
              pRVar2[lVar5] = *(double *)((long)output + lVar5 * 8) / (double)iVar4;
              lVar5 = lVar5 + 1;
            } while (iVar1 != lVar5);
          }
        }
        else if (0 < (long)ref_histogram->nstat) {
          memset(ref_histogram->stats,0,(long)ref_histogram->nstat << 3);
        }
        free(output);
        uVar3 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x150,"ref_histogram_gather_stat",(ulong)uVar3,"sum");
      }
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather_stat(REF_HISTOGRAM ref_histogram,
                                             REF_MPI ref_mpi) {
  REF_DBL *stats;
  REF_INT i, observations;

  ref_malloc(stats, ref_histogram_nstat(ref_histogram), REF_DBL);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->stats, stats,
                  ref_histogram_nstat(ref_histogram), REF_DBL_TYPE),
      "sum");

  if (ref_mpi_once(ref_mpi)) {
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    if (observations > 0)
      for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
        ref_histogram_stat(ref_histogram, i) = stats[i] / (REF_DBL)observations;
  } else {
    for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
      ref_histogram_stat(ref_histogram, i) = 0.0;
  }

  ref_free(stats);

  return REF_SUCCESS;
}